

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  ulong uVar1;
  code *pcVar2;
  SerialArena *this_00;
  undefined8 *puVar3;
  Memory MVar4;
  size_t space_allocated;
  size_t local_18;
  
  for (this_00 = *(SerialArena **)(this + 0x10); this_00 != (SerialArena *)0x0;
      this_00 = this_00->next_) {
    SerialArena::CleanupList(this_00);
  }
  local_18 = 0;
  MVar4 = Free(this,&local_18);
  uVar1 = *(ulong *)(this + 8) & 0xfffffffffffffff8;
  if (uVar1 == 0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = *(undefined8 **)(uVar1 + 0x20);
  }
  if ((*(ulong *)(this + 8) & 1) == 0) {
    if (uVar1 == 0) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = *(code **)(uVar1 + 0x18);
    }
    if (pcVar2 == (code *)0x0) {
      operator_delete(MVar4.ptr);
    }
    else {
      (*pcVar2)(MVar4.ptr,MVar4.size);
    }
  }
  local_18 = local_18 + MVar4.size;
  if (puVar3 != (undefined8 *)0x0) {
    (**(code **)*puVar3)(puVar3,local_18);
  }
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  size_t space_allocated = 0;
  auto mem = Free(&space_allocated);

  // Policy is about to get deleted.
  auto* p = alloc_policy_.get();
  ArenaMetricsCollector* collector = p ? p->metrics_collector : nullptr;

  if (alloc_policy_.is_user_owned_initial_block()) {
    space_allocated += mem.size;
  } else {
    GetDeallocator(alloc_policy_.get(), &space_allocated)(mem);
  }

  if (collector) collector->OnDestroy(space_allocated);
}